

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.c
# Opt level: O0

char * duckdb_shell_sqlite3_vsnprintf(int n,char *zBuf,char *zFormat,__va_list_tag *ap)

{
  char *in_RSI;
  int in_EDI;
  StrAccum acc;
  __va_list_tag *in_stack_000002c0;
  char *in_stack_000002c8;
  StrAccum *in_stack_000002d0;
  StrAccum SStack_48;
  char *local_18;
  char *local_8;
  
  local_8 = in_RSI;
  if (0 < in_EDI) {
    local_18 = in_RSI;
    duckdb_shell_sqlite3StrAccumInit(&SStack_48,(void *)0x0,in_RSI,in_EDI,0);
    duckdb_shell_sqlite3VXPrintf(in_stack_000002d0,in_stack_000002c8,in_stack_000002c0);
    local_18[SStack_48.nChar] = '\0';
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

char *sqlite3_vsnprintf(int n, char *zBuf, const char *zFormat, va_list ap) {
	StrAccum acc;
	if (n <= 0)
		return zBuf;
#ifdef SQLITE_ENABLE_API_ARMOR
	if (zBuf == 0 || zFormat == 0) {
		(void)SQLITE_MISUSE_BKPT;
		if (zBuf)
			zBuf[0] = 0;
		return zBuf;
	}
#endif
	sqlite3StrAccumInit(&acc, 0, zBuf, n, 0);
	sqlite3VXPrintf(&acc, zFormat, ap);
	zBuf[acc.nChar] = 0;
	return zBuf;
}